

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

void spvc_msl_resource_binding_init(spvc_msl_resource_binding *binding)

{
  binding->desc_set = 0;
  binding->binding = 0;
  binding->msl_buffer = 0;
  binding->msl_texture = 0;
  binding->msl_sampler = 0;
  binding->stage = SpvExecutionModelMax;
  return;
}

Assistant:

void spvc_msl_resource_binding_init(spvc_msl_resource_binding *binding)
{
#if SPIRV_CROSS_C_API_MSL
	MSLResourceBinding binding_default;
	binding->desc_set = binding_default.desc_set;
	binding->binding = binding_default.binding;
	binding->msl_buffer = binding_default.msl_buffer;
	binding->msl_texture = binding_default.msl_texture;
	binding->msl_sampler = binding_default.msl_sampler;
	binding->stage = static_cast<SpvExecutionModel>(binding_default.stage);
#else
	memset(binding, 0, sizeof(*binding));
#endif
}